

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_cp_setfromcod(jpc_dec_cp_t *cp,jpc_cod_t *cod)

{
  uint_fast8_t uVar1;
  int local_24;
  jpc_dec_ccp_t *pjStack_20;
  int compno;
  jpc_dec_ccp_t *ccp;
  jpc_cod_t *cod_local;
  jpc_dec_cp_t *cp_local;
  
  cp->flags = cp->flags | 1;
  cp->prgord = cod->prg;
  if (cod->mctrans == '\0') {
    cp->mctid = '\0';
  }
  else {
    uVar1 = '\x02';
    if ((cod->compparms).qmfbid == '\0') {
      uVar1 = '\x01';
    }
    cp->mctid = uVar1;
  }
  cp->numlyrs = cod->numlyrs;
  cp->csty = cod->csty & 6;
  local_24 = 0;
  pjStack_20 = cp->ccps;
  for (; local_24 < cp->numcomps; local_24 = local_24 + 1) {
    jpc_dec_cp_setfromcox(cp,pjStack_20,&cod->compparms,0);
    pjStack_20 = pjStack_20 + 1;
  }
  cp->flags = cp->flags | 1;
  return 0;
}

Assistant:

static int jpc_dec_cp_setfromcod(jpc_dec_cp_t *cp, jpc_cod_t *cod)
{
	jpc_dec_ccp_t *ccp;
	int compno;
	cp->flags |= JPC_CSET;
	cp->prgord = cod->prg;
	if (cod->mctrans) {
		cp->mctid = (cod->compparms.qmfbid == JPC_COX_INS) ? (JPC_MCT_ICT) : (JPC_MCT_RCT);
	} else {
		cp->mctid = JPC_MCT_NONE;
	}
	cp->numlyrs = cod->numlyrs;
	cp->csty = cod->csty & (JPC_COD_SOP | JPC_COD_EPH);
	for (compno = 0, ccp = cp->ccps; compno < cp->numcomps;
	  ++compno, ++ccp) {
		jpc_dec_cp_setfromcox(cp, ccp, &cod->compparms, 0);
	}
	cp->flags |= JPC_CSET;
	return 0;
}